

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeBuiltin
          (Interpreter *this,string *name,Params *params)

{
  unsigned_long uVar1;
  long lVar2;
  ulong uVar3;
  _Rb_tree_node_base *p_Var4;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  Interpreter *__x;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Value VVar7;
  HeapClosure *local_60;
  double local_58;
  _Rb_tree_node_base _Stack_50;
  size_t sStack_30;
  
  _Stack_50._M_left = &_Stack_50;
  _Stack_50._M_parent = (_Base_ptr)0x0;
  local_58 = 0.0;
  _Stack_50._M_color = _S_red;
  _Stack_50._4_4_ = 0;
  sStack_30 = 0;
  _Stack_50._M_right = _Stack_50._M_left;
  VVar7._0_8_ = (HeapClosure *)operator_new(0x90);
  HeapClosure::HeapClosure
            (VVar7._0_8_,(BindingFrame *)&local_58,(HeapObject *)0x0,0,params,(AST *)0x0,name);
  __x = (Interpreter *)&local_60;
  local_60 = VVar7._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(&(this->heap).entities,(value_type *)__x);
  ((VVar7._0_8_)->super_HeapEntity).mark = (this->heap).lastMark;
  lVar2 = (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = lVar2 >> 3;
  (this->heap).numEntities = uVar3;
  if (((this->heap).gcTuneMinObjects < uVar3) &&
     (auVar5._8_4_ = (int)(lVar2 >> 0x23), auVar5._0_8_ = uVar3, auVar5._12_4_ = 0x45300000,
     uVar1 = (this->heap).lastNumEntities, auVar6._8_4_ = (int)(uVar1 >> 0x20), auVar6._0_8_ = uVar1
     , auVar6._12_4_ = 0x45300000,
     ((auVar6._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
     (this->heap).gcTuneGrowthTrigger <
     (auVar5._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0))) {
    Heap::markFrom(&this->heap,(HeapEntity *)VVar7._0_8_);
    __x = this;
    Stack::mark(&this->stack,&this->heap);
    if (((this->scratch).t & ARRAY) != NULL_TYPE) {
      __x = (Interpreter *)(this->scratch).v.h;
      Heap::markFrom(&this->heap,(HeapEntity *)__x);
    }
    for (p_Var4 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      __x = *(Interpreter **)(*(long *)(p_Var4 + 3) + 0x40);
      if (__x != (Interpreter *)0x0) {
        Heap::markFrom(&this->heap,(HeapEntity *)__x);
      }
    }
    for (p_Var4 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      __x = *(Interpreter **)(p_Var4 + 2);
      Heap::markFrom(&this->heap,(HeapEntity *)__x);
    }
    Heap::sweep(&this->heap);
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              *)_Stack_50._M_parent,(_Link_type)__x);
  VVar7.v.h = extraout_RDX.h;
  return VVar7;
}

Assistant:

Value makeBuiltin(const std::string &name, const HeapClosure::Params &params)
    {
        AST *body = nullptr;
        Value r;
        r.t = Value::FUNCTION;
        r.v.h = makeHeap<HeapClosure>(BindingFrame(), nullptr, 0, params, body, name);
        return r;
    }